

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdReport.cpp
# Opt level: O1

int CmdReport(CLI *cli,Rules *rules,Database *database,Extensions *extensions)

{
  IntervalFilterAllInRange *pIVar1;
  IntervalFilterAllInRange *pIVar2;
  IntervalFilterAllWithTags *pIVar3;
  pointer pcVar4;
  pointer pcVar5;
  CLI *this;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  long *plVar9;
  string *psVar10;
  string *psVar11;
  IntervalFilterAllWithTags *pIVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *script;
  long lVar13;
  pointer pbVar14;
  undefined8 uVar15;
  char *__end;
  pointer pbVar16;
  pointer this_00;
  pointer pAVar17;
  initializer_list<std::shared_ptr<IntervalFilter>_> __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  matches;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  output;
  string default_hint;
  string script_name;
  string report_hint;
  string script_path;
  Range default_range;
  IntervalFilterAndGroup filtering;
  stringstream header;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  vector<Interval,_std::allocator<Interval>_> tracked;
  Range range;
  undefined1 local_488 [32];
  undefined1 local_468 [40];
  Rules *local_440;
  undefined1 local_438 [32];
  string local_418;
  string local_3f8;
  undefined1 local_3d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  undefined1 local_398 [32];
  undefined8 local_378;
  undefined8 uStack_370;
  time_t local_368;
  Datetime DStack_360;
  Extensions *local_328;
  string local_320;
  IntervalFilterAndGroup local_300;
  Database *local_2d8;
  CLI *local_2d0;
  pointer local_2c8;
  undefined1 local_2c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  _Alloc_hider local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290 [5];
  ios_base local_240 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [48];
  vector<Interval,_std::allocator<Interval>_> local_e8;
  vector<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>
  local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  Range local_98;
  
  local_3b8._M_allocated_capacity = (size_type)&local_3a8;
  local_3b8._8_8_ = 0;
  local_3a8._M_local_buf[0] = '\0';
  this_00 = (cli->_args).super__Vector_base<A2,_std::allocator<A2>_>._M_impl.super__Vector_impl_data
            ._M_start;
  pAVar17 = (cli->_args).super__Vector_base<A2,_std::allocator<A2>_>._M_impl.super__Vector_impl_data
            ._M_finish;
  local_440 = rules;
  local_328 = extensions;
  local_2d8 = database;
  local_2d0 = cli;
  if (this_00 != pAVar17) {
    local_2c8 = pAVar17;
    do {
      local_2c0._0_8_ = local_2c0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"EXT","");
      bVar6 = A2::hasTag(this_00,(string *)local_2c0);
      if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
        operator_delete((void *)local_2c0._0_8_,local_2b0._M_allocated_capacity + 1);
      }
      if (bVar6) {
        local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"canonical","");
        A2::attribute(&local_3f8,this_00,&local_418);
        Extensions::all_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_3d8,local_328);
        uVar15 = local_3d8._8_8_;
        local_488._0_8_ = (IntervalFilterAllInRange *)0x0;
        local_488._8_8_ = (pointer)0x0;
        local_488._16_8_ = 0;
        for (psVar11 = (string *)local_3d8._0_8_; psVar11 != (string *)uVar15; psVar11 = psVar11 + 1
            ) {
          Path::Path((Path *)local_2c0,psVar11);
          Path::name_abi_cxx11_((string *)local_398,(Path *)local_2c0);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_488,
                     (string *)local_398);
          if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
            operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
          }
          if (local_2a0._M_p != local_2c0 + 0x30) {
            operator_delete(local_2a0._M_p,local_290[0]._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
            operator_delete((void *)local_2c0._0_8_,local_2b0._M_allocated_capacity + 1);
          }
        }
        local_468._0_8_ = (IntervalFilterAllWithTags *)0x0;
        local_468._8_8_ = (IntervalFilterAllWithTags *)0x0;
        local_468._16_8_ = (pointer)0x0;
        autoComplete(&local_3f8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_488,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_468,1);
        uVar15 = local_3d8._8_8_;
        if (local_468._0_8_ == local_468._8_8_) {
          psVar11 = (string *)__cxa_allocate_exception(0x20);
          local_2c0._0_8_ = local_2c0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2c0,"The report \'{1}\' is not recognized.","");
          local_398._0_8_ = local_398 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_398,local_3f8._M_dataplus._M_p,
                     local_3f8._M_dataplus._M_p + local_3f8._M_string_length);
          format<std::__cxx11::string>
                    (psVar11,(string *)local_2c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398)
          ;
          __cxa_throw(psVar11,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        psVar11 = (string *)local_3d8._0_8_;
        if (0x20 < (ulong)(local_468._8_8_ - local_468._0_8_)) {
          psVar11 = (string *)__cxa_allocate_exception(0x20);
          local_2c0._0_8_ = local_2c0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2c0,
                     "The report \'{1}\' is ambiguous, and could mean one of: {2}","");
          local_398._0_8_ = local_398 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_398,local_3f8._M_dataplus._M_p,
                     local_3f8._M_dataplus._M_p + local_3f8._M_string_length);
          local_118._0_8_ = local_118 + 0x10;
          local_118._16_2_ = 0x202c;
          local_118._8_8_ = 2;
          local_118[0x12] = '\0';
          join((string *)&local_98,(string *)local_118,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_468);
          format<std::__cxx11::string,std::__cxx11::string>
                    (psVar11,(string *)local_2c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98)
          ;
          __cxa_throw(psVar11,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        for (; psVar11 != (string *)uVar15; psVar11 = psVar11 + 1) {
          Path::Path((Path *)local_2c0,psVar11);
          Path::name_abi_cxx11_((string *)local_398,(Path *)local_2c0);
          if (local_398._8_8_ == *(size_t *)(local_468._0_8_ + 8)) {
            if (local_398._8_8_ == 0) {
              bVar6 = true;
            }
            else {
              iVar7 = bcmp((void *)local_398._0_8_,*(void **)local_468._0_8_,local_398._8_8_);
              bVar6 = iVar7 == 0;
            }
          }
          else {
            bVar6 = false;
          }
          if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
            operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
          }
          if (local_2a0._M_p != local_2c0 + 0x30) {
            operator_delete(local_2a0._M_p,local_290[0]._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
            operator_delete((void *)local_2c0._0_8_,local_2b0._M_allocated_capacity + 1);
          }
          if (bVar6) {
            local_300.super_IntervalFilter._vptr_IntervalFilter = (_func_int **)&local_300._filters;
            pcVar5 = (psVar11->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_300,pcVar5,pcVar5 + psVar11->_M_string_length);
            if (bVar6) goto LAB_001460b5;
          }
        }
        local_300.super_IntervalFilter._vptr_IntervalFilter = (_func_int **)&local_300._filters;
        local_300.super_IntervalFilter._done = false;
        local_300.super_IntervalFilter._9_7_ = 0;
        local_300._filters.
        super__Vector_base<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
LAB_001460b5:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_468);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_488);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_3d8);
        std::__cxx11::string::operator=((string *)local_3b8._M_local_buf,(string *)&local_300);
        if ((vector<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>
             *)local_300.super_IntervalFilter._vptr_IntervalFilter != &local_300._filters) {
          operator_delete(local_300.super_IntervalFilter._vptr_IntervalFilter,
                          CONCAT71(local_300._filters.
                                   super__Vector_base<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                   local_300._filters.
                                   super__Vector_base<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._0_1_) + 1);
        }
        pAVar17 = local_2c8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_dataplus._M_p != &local_418.field_2) {
          operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
        }
      }
      this_00 = this_00 + 1;
    } while (this_00 != pAVar17);
  }
  if (local_3b8._8_8_ == 0) {
    psVar10 = (string *)__cxa_allocate_exception(0x20);
    *(string **)psVar10 = psVar10 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>(psVar10,"Specify which report to run.","");
    __cxa_throw(psVar10,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  getScriptName(&local_3f8,(string *)&local_3b8);
  pcVar5 = local_2c0 + 0x10;
  local_2c0._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"reports.range","");
  pcVar4 = local_398 + 0x10;
  local_398._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"all","");
  Rules::get(&local_418,local_440,(string *)local_2c0,(string *)local_398);
  if ((pointer)local_398._0_8_ != pcVar4) {
    operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
  }
  if ((pointer)local_2c0._0_8_ != pcVar5) {
    operator_delete((void *)local_2c0._0_8_,local_2b0._M_allocated_capacity + 1);
  }
  local_398._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"reports.{1}.range","");
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,local_3f8._M_dataplus._M_p,
             local_3f8._M_dataplus._M_p + local_3f8._M_string_length);
  format<std::__cxx11::string>((string *)local_2c0,(string *)local_398,&local_138);
  Rules::get((string *)local_3d8,local_440,(string *)local_2c0,&local_418);
  if ((pointer)local_2c0._0_8_ != pcVar5) {
    operator_delete((void *)local_2c0._0_8_,local_2b0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  this = local_2d0;
  if ((pointer)local_398._0_8_ != pcVar4) {
    operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
  }
  local_398._8_8_ = 0;
  DStack_360._seconds = 0;
  DStack_360._offset = 0;
  DStack_360._utc = false;
  DStack_360._33_7_ = 0;
  DStack_360._week = 0;
  DStack_360._weekday = 0;
  DStack_360._julian = 0;
  DStack_360._day = 0;
  local_368 = 0;
  DStack_360._year = 0;
  DStack_360._month = 0;
  local_378._0_4_ = 0;
  local_378._4_4_ = 0;
  uStack_370._0_1_ = false;
  uStack_370._1_7_ = 0;
  local_398._16_8_ = 0;
  local_398._24_8_ = 0;
  DStack_360._date = 0;
  local_398._0_8_ = &PTR__Range_001a1778;
  Datetime::Datetime((Datetime *)(local_398 + 8),0);
  Datetime::Datetime(&DStack_360,0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0,":",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8);
  expandIntervalHint((string *)local_2c0,(Range *)local_398);
  if ((pointer)local_2c0._0_8_ != pcVar5) {
    operator_delete((void *)local_2c0._0_8_,local_2b0._M_allocated_capacity + 1);
  }
  CLI::getTags_abi_cxx11_
            ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_118,this);
  CLI::getRange(&local_98,this,(Range *)local_398);
  local_488._0_8_ = (IntervalFilterAllInRange *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IntervalFilterAllInRange,std::allocator<IntervalFilterAllInRange>,Range&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_488 + 8),
             (IntervalFilterAllInRange **)local_488,(allocator<IntervalFilterAllInRange> *)local_468
             ,&local_98);
  local_2c0._0_8_ = local_488._0_8_;
  local_2c0._8_8_ = local_488._8_8_;
  local_488._0_8_ = (IntervalFilterAllInRange *)0x0;
  local_488._8_8_ = (pointer)0x0;
  local_468._0_8_ = (IntervalFilterAllWithTags *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IntervalFilterAllWithTags,std::allocator<IntervalFilterAllWithTags>,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_468 + 8),
             (IntervalFilterAllWithTags **)local_468,
             (allocator<IntervalFilterAllWithTags> *)local_438,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_118);
  local_2b0._M_allocated_capacity = local_468._0_8_;
  local_2b0._8_8_ = local_468._8_8_;
  local_468._0_8_ = (IntervalFilterAllWithTags *)0x0;
  local_468._8_8_ = (pointer)0x0;
  __l._M_len = 2;
  __l._M_array = (iterator)local_2c0;
  std::vector<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>::
  vector(&local_d0,__l,(allocator_type *)local_438);
  IntervalFilterAndGroup::IntervalFilterAndGroup(&local_300,&local_d0);
  std::vector<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>::
  ~vector(&local_d0);
  lVar13 = 0x20;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_2c8 + lVar13) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_2c8 + lVar13));
    }
    lVar13 = lVar13 + -0x10;
  } while (lVar13 != 0);
  if ((pointer)local_468._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_468._8_8_);
  }
  if ((pointer)local_488._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_488._8_8_);
  }
  getTracked(&local_e8,local_2d8,local_440,&local_300.super_IntervalFilter);
  pcVar5 = local_2c0 + 0x10;
  local_2c0._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"temp.report.start","");
  bVar6 = Range::is_started(&local_98);
  if (bVar6) {
    Datetime::toISO_abi_cxx11_((string *)local_488,&local_98.start);
  }
  else {
    local_488._0_8_ = local_488 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"");
  }
  Rules::set(local_440,(string *)local_2c0,(string *)local_488);
  pIVar2 = (IntervalFilterAllInRange *)(local_488 + 0x10);
  if ((IntervalFilterAllInRange *)local_488._0_8_ != pIVar2) {
    operator_delete((void *)local_488._0_8_,local_488._16_8_ + 1);
  }
  if ((pointer)local_2c0._0_8_ != pcVar5) {
    operator_delete((void *)local_2c0._0_8_,local_2b0._M_allocated_capacity + 1);
  }
  local_2c0._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"temp.report.end","");
  bVar6 = Range::is_ended(&local_98);
  if (bVar6) {
    Datetime::toISO_abi_cxx11_((string *)local_488,&local_98.end);
  }
  else {
    local_488._0_8_ = pIVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"");
  }
  Rules::set(local_440,(string *)local_2c0,(string *)local_488);
  if ((IntervalFilterAllInRange *)local_488._0_8_ != pIVar2) {
    operator_delete((void *)local_488._0_8_,local_488._16_8_ + 1);
  }
  if ((pointer)local_2c0._0_8_ != pcVar5) {
    operator_delete((void *)local_2c0._0_8_,local_2b0._M_allocated_capacity + 1);
  }
  local_2c0._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"temp.report.tags","");
  local_468._0_8_ = (IntervalFilterAllWithTags *)(local_468 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_468,",","");
  joinQuotedIfNeeded<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
            ((string *)local_488,(string *)local_468,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_118);
  Rules::set(local_440,(string *)local_2c0,(string *)local_488);
  if ((IntervalFilterAllInRange *)local_488._0_8_ != pIVar2) {
    operator_delete((void *)local_488._0_8_,local_488._16_8_ + 1);
  }
  if ((IntervalFilterAllWithTags *)local_468._0_8_ !=
      (IntervalFilterAllWithTags *)(local_468 + 0x10)) {
    operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
  }
  if ((pointer)local_2c0._0_8_ != pcVar5) {
    operator_delete((void *)local_2c0._0_8_,local_2b0._M_allocated_capacity + 1);
  }
  local_2c0._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"temp.version","");
  local_488._0_8_ = pIVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"1.8.0-dev","");
  Rules::set(local_440,(string *)local_2c0,(string *)local_488);
  if ((IntervalFilterAllInRange *)local_488._0_8_ != pIVar2) {
    operator_delete((void *)local_488._0_8_,local_488._16_8_ + 1);
  }
  if ((pointer)local_2c0._0_8_ != pcVar5) {
    operator_delete((void *)local_2c0._0_8_,local_2b0._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_2c0);
  local_488._0_8_ = pIVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"");
  Rules::all((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_438,local_440,(string *)local_488);
  if ((IntervalFilterAllInRange *)local_488._0_8_ != pIVar2) {
    operator_delete((void *)local_488._0_8_,local_488._16_8_ + 1);
  }
  uVar15 = local_438._8_8_;
  if (local_438._0_8_ != local_438._8_8_) {
    psVar11 = (string *)local_438._0_8_;
    do {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)(local_2c0 + 0x10),(psVar11->_M_dataplus)._M_p,
                          psVar11->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
      local_468._0_8_ = local_468 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"","");
      Rules::get((string *)local_488,local_440,psVar11,(string *)local_468);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(char *)local_488._0_8_,local_488._8_8_);
      local_320._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_320,1);
      if ((IntervalFilterAllInRange *)local_488._0_8_ != pIVar2) {
        operator_delete((void *)local_488._0_8_,local_488._16_8_ + 1);
      }
      if ((IntervalFilterAllWithTags *)local_468._0_8_ !=
          (IntervalFilterAllWithTags *)(local_468 + 0x10)) {
        operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
      }
      psVar11 = psVar11 + 1;
    } while (psVar11 != (string *)uVar15);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_438);
  std::__cxx11::stringbuf::str();
  plVar9 = (long *)std::__cxx11::string::_M_replace_aux((ulong)local_438,local_438._8_8_,0,'\x01');
  pIVar3 = (IntervalFilterAllWithTags *)(local_468 + 0x10);
  pIVar12 = (IntervalFilterAllWithTags *)(plVar9 + 2);
  if ((IntervalFilterAllWithTags *)*plVar9 == pIVar12) {
    local_468._16_8_ = (pIVar12->super_IntervalFilter)._vptr_IntervalFilter;
    local_468._24_8_ = plVar9[3];
    local_468._0_8_ = pIVar3;
  }
  else {
    local_468._16_8_ = (pIVar12->super_IntervalFilter)._vptr_IntervalFilter;
    local_468._0_8_ = (IntervalFilterAllWithTags *)*plVar9;
  }
  local_468._8_8_ = plVar9[1];
  *plVar9 = (long)pIVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  jsonFromIntervals_abi_cxx11_(&local_320,&local_e8);
  pbVar16 = (pointer)((long)&((_Alloc_hider *)local_468._8_8_)->_M_p + local_320._M_string_length);
  pbVar14 = (pointer)0xf;
  if ((IntervalFilterAllWithTags *)local_468._0_8_ != pIVar3) {
    pbVar14 = (pointer)local_468._16_8_;
  }
  if (pbVar14 < pbVar16) {
    uVar15 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_320._M_dataplus._M_p._1_7_,local_320._M_dataplus._M_p._0_1_) !=
        &local_320.field_2) {
      uVar15 = local_320.field_2._M_allocated_capacity;
    }
    if (pbVar16 <= (ulong)uVar15) {
      plVar9 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_320,0,(char *)0x0,local_468._0_8_);
      goto LAB_001469a3;
    }
  }
  plVar9 = (long *)std::__cxx11::string::_M_append
                             (local_468,
                              CONCAT71(local_320._M_dataplus._M_p._1_7_,
                                       local_320._M_dataplus._M_p._0_1_));
LAB_001469a3:
  pIVar1 = (IntervalFilterAllInRange *)(plVar9 + 2);
  if ((IntervalFilterAllInRange *)*plVar9 == pIVar1) {
    local_488._16_8_ = (pIVar1->super_IntervalFilter)._vptr_IntervalFilter;
    local_488._24_8_ = plVar9[3];
    local_488._0_8_ = pIVar2;
  }
  else {
    local_488._16_8_ = (pIVar1->super_IntervalFilter)._vptr_IntervalFilter;
    local_488._0_8_ = (IntervalFilterAllInRange *)*plVar9;
  }
  local_488._8_8_ = plVar9[1];
  *plVar9 = (long)pIVar1;
  plVar9[1] = 0;
  *(undefined1 *)&(pIVar1->super_IntervalFilter)._vptr_IntervalFilter = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_320._M_dataplus._M_p._1_7_,local_320._M_dataplus._M_p._0_1_) !=
      &local_320.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_320._M_dataplus._M_p._1_7_,local_320._M_dataplus._M_p._0_1_),
                    (ulong)(local_320.field_2._M_allocated_capacity + 1));
  }
  if ((IntervalFilterAllWithTags *)local_468._0_8_ != pIVar3) {
    operator_delete((void *)local_468._0_8_,(ulong)(local_468._16_8_ + 1));
  }
  if ((string *)local_438._0_8_ != (string *)(local_438 + 0x10)) {
    operator_delete((void *)local_438._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_438._16_8_)->_M_p + 1));
  }
  local_438._0_8_ = (pointer)0x0;
  local_438._8_8_ = (pointer)0x0;
  local_438._16_8_ = (pointer)0x0;
  split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_468,(string *)local_488,'\n');
  iVar7 = Extensions::callExtension
                    (local_328,(string *)&local_3b8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_468,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_438);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_468);
  uVar15 = local_438._8_8_;
  if ((iVar7 != 0) && (local_438._0_8_ == local_438._8_8_)) {
    psVar11 = (string *)__cxa_allocate_exception(0x20);
    local_468._0_8_ = pIVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_468,"\'{1}\' returned {2} without producing output.","");
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,local_3b8._M_allocated_capacity,
               local_3b8._8_8_ + local_3b8._M_allocated_capacity);
    format<std::__cxx11::string,int>(psVar11,(string *)local_468,&local_b8,iVar7);
    __cxa_throw(psVar11,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  if (local_438._0_8_ != local_438._8_8_) {
    pbVar16 = (pointer)local_438._0_8_;
    do {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(pbVar16->_M_dataplus)._M_p,
                          pbVar16->_M_string_length);
      local_468[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_468,1);
      pbVar16 = pbVar16 + 1;
    } while (pbVar16 != (pointer)uVar15);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_438);
  if ((IntervalFilterAllInRange *)local_488._0_8_ != pIVar2) {
    operator_delete((void *)local_488._0_8_,local_488._16_8_ + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_2c0);
  std::ios_base::~ios_base(local_240);
  std::vector<Interval,_std::allocator<Interval>_>::~vector(&local_e8);
  local_300.super_IntervalFilter._vptr_IntervalFilter = (_func_int **)&PTR_accepts_001a18f0;
  std::vector<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>::
  ~vector(&local_300._filters);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_118);
  if ((string *)local_3d8._0_8_ != (string *)(local_3d8 + 0x10)) {
    operator_delete((void *)local_3d8._0_8_,(ulong)(local_3d8._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_allocated_capacity != &local_3a8) {
    operator_delete((void *)local_3b8._M_allocated_capacity,
                    CONCAT71(local_3a8._M_allocated_capacity._1_7_,local_3a8._M_local_buf[0]) + 1);
  }
  return iVar7;
}

Assistant:

int CmdReport (
  CLI& cli,
  Rules& rules,
  Database& database,
  const Extensions& extensions)
{
  std::string script_path;
  for (auto& arg : cli._args)
  {
    if (arg.hasTag ("EXT"))
    {
      script_path = findExtension (extensions, arg.attribute ("canonical"));
    }
  }

  if (script_path.empty ())
  {
    throw std::string ("Specify which report to run.");
  }

  auto script_name = getScriptName (script_path);
  auto default_hint = rules.get ("reports.range", "all");
  auto report_hint = rules.get (format ("reports.{1}.range", script_name), default_hint);

  Range default_range = {};
  expandIntervalHint (":" + report_hint, default_range);

  // Create a filter, and if empty, choose the current week.
  auto tags = cli.getTags ();
  auto range = cli.getRange (default_range);

  IntervalFilterAndGroup filtering ({
    std::make_shared <IntervalFilterAllInRange> (range),
    std::make_shared <IntervalFilterAllWithTags> (tags)
  });

  auto tracked = getTracked (database, rules, filtering);

  // Compose Header info.
  rules.set ("temp.report.start", range.is_started () ? range.start.toISO () : "");
  rules.set ("temp.report.end",   range.is_ended ()   ? range.end.toISO ()   : "");
  rules.set ("temp.report.tags", joinQuotedIfNeeded (",", tags));
  rules.set ("temp.version", VERSION);

  std::stringstream header;

  for (auto& name : rules.all ())
  {
    header << name << ": " << rules.get (name) << '\n';
  }

  // Get the data.
  auto input = header.str ()
             + '\n'
             + jsonFromIntervals (tracked);

  // Run the extensions.
  std::vector <std::string> output;
  int rc = extensions.callExtension (script_path, split (input, '\n'), output);
  if (rc != 0 && output.empty ())
  {
    throw format ("'{1}' returned {2} without producing output.", script_path, rc);
  }

  // Display the output.
  for (auto& line : output)
  {
    std::cout << line << '\n';
  }

  return rc;
}